

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetApproxQuantileListAggregate(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType list_of_float;
  LogicalType local_40;
  LogicalType local_28;
  
  GetApproxQuantileListAggregateFunction(__return_storage_ptr__,type);
  __return_storage_ptr__->bind = BindApproxQuantile;
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  LogicalType::LogicalType(&local_40,FLOAT);
  LogicalType::LIST(&local_28,&local_40);
  LogicalType::~LogicalType(&local_40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&local_28);
  LogicalType::~LogicalType(&local_28);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetApproxQuantileListAggregate(const LogicalType &type) {
	auto fun = GetApproxQuantileListAggregateFunction(type);
	fun.bind = BindApproxQuantile;
	fun.serialize = ApproximateQuantileBindData::Serialize;
	fun.deserialize = ApproximateQuantileBindData::Deserialize;
	// temporarily push an argument so we can bind the actual quantile
	auto list_of_float = LogicalType::LIST(LogicalType::FLOAT);
	fun.arguments.push_back(list_of_float);
	return fun;
}